

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

Node * mainposition(Table *t,TValue *key)

{
  lua_CFunction p_Var1;
  uint uVar2;
  TString *s;
  TValue *key_local;
  Table *t_local;
  
  switch(key->tt_ & 0x3f) {
  case 1:
    t_local = (Table *)(t->node + (int)((key->value_).b & (1 << (t->lsizenode & 0x1f)) - 1U));
    break;
  case 2:
    t_local = (Table *)(t->node +
                       ((ulong)(key->value_).gc & 0xffffffff) %
                       (ulong)((1 << (t->lsizenode & 0x1f)) - 1U | 1));
    break;
  case 3:
    t_local = (Table *)hashnum(t,(key->value_).n);
    break;
  case 4:
    t_local = (Table *)(t->node +
                       (int)(*(uint *)((key->value_).f + 0xc) & (1 << (t->lsizenode & 0x1f)) - 1U));
    break;
  default:
    t_local = (Table *)(t->node +
                       ((ulong)(key->value_).gc & 0xffffffff) %
                       (ulong)((1 << (t->lsizenode & 0x1f)) - 1U | 1));
    break;
  case 0x14:
    p_Var1 = (key->value_).f;
    if (p_Var1[10] == (_func_int_lua_State_ptr)0x0) {
      uVar2 = luaS_hash((char *)(p_Var1 + 0x18),*(size_t *)(p_Var1 + 0x10),*(uint *)(p_Var1 + 0xc));
      *(uint *)(p_Var1 + 0xc) = uVar2;
      p_Var1[10] = (code)0x1;
    }
    t_local = (Table *)(t->node +
                       (int)(*(uint *)((key->value_).f + 0xc) & (1 << (t->lsizenode & 0x1f)) - 1U));
    break;
  case 0x16:
    t_local = (Table *)(t->node +
                       ((ulong)(key->value_).gc & 0xffffffff) %
                       (ulong)((1 << (t->lsizenode & 0x1f)) - 1U | 1));
  }
  return (Node *)t_local;
}

Assistant:

static Node *mainposition (const Table *t, const TValue *key) {
  switch (ttype(key)) {
    case LUA_TNUMBER:
      return hashnum(t, nvalue(key));
    case LUA_TLNGSTR: {
      TString *s = rawtsvalue(key);
      if (s->tsv.extra == 0) {  /* no hash? */
        s->tsv.hash = luaS_hash(getstr(s), s->tsv.len, s->tsv.hash);
        s->tsv.extra = 1;  /* now it has its hash */
      }
      return hashstr(t, rawtsvalue(key));
    }
    case LUA_TSHRSTR:
      return hashstr(t, rawtsvalue(key));
    case LUA_TBOOLEAN:
      return hashboolean(t, bvalue(key));
    case LUA_TLIGHTUSERDATA:
      return hashpointer(t, pvalue(key));
    case LUA_TLCF:
      return hashpointer(t, fvalue(key));
    default:
      return hashpointer(t, gcvalue(key));
  }
}